

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_aspect_format.c
# Opt level: O0

int log_aspect_format_impl_size_cb
              (log_aspect aspect,log_policy policy,log_aspect_notify_data notify_data)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 *in_RDX;
  log_policy in_RSI;
  log_policy_format_impl format_impl;
  log_aspect_format_size_type *size_args;
  uint local_4;
  
  puVar1 = (undefined8 *)log_policy_derived(in_RSI);
  uVar2 = (*(code *)*puVar1)(in_RSI,*in_RDX);
  in_RDX[1] = uVar2;
  local_4 = (uint)(in_RDX[1] == 0);
  return local_4;
}

Assistant:

static int log_aspect_format_impl_size_cb(log_aspect aspect, log_policy policy, log_aspect_notify_data notify_data)
{
	struct log_aspect_format_size_type *size_args = notify_data;

	log_policy_format_impl format_impl = log_policy_derived(policy);

	size_args->size = format_impl->size(policy, size_args->record);

	(void)aspect;

	if (size_args->size == 0)
	{
		return 1;
	}

	return 0;
}